

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O0

void VW::copy_example_metadata(bool param_1,example *dst,example *src)

{
  features *this;
  long in_RDX;
  long in_RSI;
  undefined7 in_stack_00000030;
  features *in_stack_ffffffffffffffc8;
  v_array<char> *in_stack_ffffffffffffffd8;
  v_array<char> *in_stack_ffffffffffffffe0;
  
  copy_array<char>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *(undefined8 *)(in_RSI + 0x6898) = *(undefined8 *)(in_RDX + 0x6898);
  *(undefined8 *)(in_RSI + 0x6820) = *(undefined8 *)(in_RDX + 0x6820);
  *(undefined4 *)(in_RSI + 0x68a8) = *(undefined4 *)(in_RDX + 0x68a8);
  if (*(long *)(in_RDX + 0x68c0) == 0) {
    *(undefined8 *)(in_RSI + 0x68c0) = 0;
  }
  else {
    this = (features *)operator_new(0x68);
    features::features((features *)CONCAT17(param_1,in_stack_00000030));
    *(features **)(in_RSI + 0x68c0) = this;
    features::deep_copy_from(this,in_stack_ffffffffffffffc8);
  }
  *(undefined4 *)(in_RSI + 0x68b0) = *(undefined4 *)(in_RDX + 0x68b0);
  *(undefined4 *)(in_RSI + 0x6870) = *(undefined4 *)(in_RDX + 0x6870);
  *(undefined4 *)(in_RSI + 0x68b8) = *(undefined4 *)(in_RDX + 0x68b8);
  *(byte *)(in_RSI + 0x68c8) = *(byte *)(in_RDX + 0x68c8) & 1;
  *(byte *)(in_RSI + 0x68c9) = *(byte *)(in_RDX + 0x68c9) & 1;
  *(byte *)(in_RSI + 0x68ca) = *(byte *)(in_RDX + 0x68ca) & 1;
  *(byte *)(in_RSI + 0x68cb) = *(byte *)(in_RDX + 0x68cb) & 1;
  return;
}

Assistant:

void copy_example_metadata(bool /* audit */, example* dst, example* src)
{
  copy_array(dst->tag, src->tag);
  dst->example_counter = src->example_counter;

  dst->ft_offset = src->ft_offset;

  dst->partial_prediction = src->partial_prediction;
  if (src->passthrough == nullptr)
    dst->passthrough = nullptr;
  else
  {
    dst->passthrough = new features;
    dst->passthrough->deep_copy_from(*src->passthrough);
  }
  dst->loss = src->loss;
  dst->weight = src->weight;
  dst->confidence = src->confidence;
  dst->test_only = src->test_only;
  dst->end_pass = src->end_pass;
  dst->sorted = src->sorted;
  dst->in_use = src->in_use;
}